

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate-vfp.inc.c
# Opt level: O1

_Bool trans_VMOV_imm_sp(DisasContext_conflict1 *s,arg_VMOV_imm_sp *a)

{
  uint uVar1;
  TCGContext_conflict1 *tcg_ctx;
  _Bool _Var2;
  TCGv_i32 pTVar3;
  int iVar4;
  int iVar5;
  uint uVar6;
  bool bVar7;
  
  uVar1 = s->isar->mvfr0;
  if ((uVar1 & 0xe0) != 0) {
    tcg_ctx = s->uc->tcg_ctx;
    iVar5 = s->vec_len;
    uVar6 = a->vd;
    if (((uVar1 & 0xf000000) != 0) || ((iVar5 == 0 && (s->vec_stride == 0)))) {
      iVar4 = 0;
      _Var2 = full_vfp_access_check(s,false);
      if (!_Var2) {
        return true;
      }
      if (0 < iVar5) {
        if ((uVar6 & 0x18) == 0) {
          iVar4 = 0;
          iVar5 = 0;
        }
        else {
          iVar4 = s->vec_stride + 1;
        }
      }
      uVar1 = a->imm;
      pTVar3 = tcg_const_i32_aarch64
                         (tcg_ctx,(uint)((uVar1 & 0x40) == 0) * 0x2000000 +
                                  ((uVar1 & 0x3f) << 0x13 | (uVar1 & 0xffffff80) << 0x18) +
                                  0x3e000000);
      while( true ) {
        tcg_gen_op3_aarch64(tcg_ctx,INDEX_op_st_i32,(TCGArg)(pTVar3 + (long)tcg_ctx),
                            (TCGArg)(tcg_ctx->cpu_env + (long)tcg_ctx),
                            (ulong)(uVar6 * 4 & 4) +
                            ((ulong)(uVar6 * 4 & 8) | (ulong)(uVar6 >> 2) << 8) + 0xc10);
        bVar7 = iVar5 == 0;
        iVar5 = iVar5 + -1;
        if (bVar7) break;
        uVar6 = uVar6 & 0xfffffff8 | iVar4 + uVar6 & 7;
      }
      tcg_temp_free_internal_aarch64(tcg_ctx,(TCGTemp *)(pTVar3 + (long)tcg_ctx));
      return true;
    }
  }
  return false;
}

Assistant:

static bool trans_VMOV_imm_sp(DisasContext *s, arg_VMOV_imm_sp *a)
{
    TCGContext *tcg_ctx = s->uc->tcg_ctx;
    uint32_t delta_d = 0;
    int veclen = s->vec_len;
    TCGv_i32 fd;
    uint32_t vd;

    vd = a->vd;

    if (!dc_isar_feature(aa32_fpsp_v3, s)) {
        return false;
    }

    if (!dc_isar_feature(aa32_fpshvec, s) &&
        (veclen != 0 || s->vec_stride != 0)) {
        return false;
    }

    if (!vfp_access_check(s)) {
        return true;
    }

    if (veclen > 0) {
        /* Figure out what type of vector operation this is.  */
        if (vfp_sreg_is_scalar(vd)) {
            /* scalar */
            veclen = 0;
        } else {
            delta_d = s->vec_stride + 1;
        }
    }

    fd = tcg_const_i32(tcg_ctx, vfp_expand_imm(MO_32, a->imm));

    for (;;) {
        neon_store_reg32(tcg_ctx, fd, vd);

        if (veclen == 0) {
            break;
        }

        /* Set up the operands for the next iteration */
        veclen--;
        vd = vfp_advance_sreg(vd, delta_d);
    }

    tcg_temp_free_i32(tcg_ctx, fd);
    return true;
}